

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_size_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_22c364::ByteSizeTest_UnpopulatedMsg_Test::~ByteSizeTest_UnpopulatedMsg_Test
          (ByteSizeTest_UnpopulatedMsg_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteSizeTest, UnpopulatedMsg) {
  upb_Arena* arena = upb_Arena_New();
  protobuf_test_messages_proto2_TestAllTypesProto2* msg =
      protobuf_test_messages_proto2_TestAllTypesProto2_new(arena);
  auto res = upb_ByteSize(UPB_UPCAST(msg), kTestMiniTable);
  EXPECT_EQ(res, 0);
  upb_Arena_Free(arena);
}